

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

int64_t SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  SUNStlVector_SUNHashMapKeyValue pSVar1;
  ulong uVar2;
  ulong uVar3;
  SUNHashMapKeyValue *ppSVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  int64_t iVar10;
  
  iVar10 = -99;
  if (value != (void **)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    pSVar1 = map->buckets;
    uVar2 = pSVar1->capacity;
    if (uVar2 - 1 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0x100000001b3;
      cVar6 = *key;
      if (cVar6 == '\0') {
        uVar7 = 0x100000001b3;
      }
      else {
        pcVar8 = key + 1;
        do {
          uVar7 = ((long)cVar6 ^ uVar7) * -0x340d631b7bdddcdb;
          cVar6 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar6 != '\0');
      }
      uVar7 = uVar7 % (uVar2 - 1);
    }
    uVar3 = pSVar1->size;
    ppSVar4 = pSVar1->values;
    if ((ppSVar4[uVar7] == (SUNHashMapKeyValue)0x0) ||
       (iVar5 = strcmp(ppSVar4[uVar7]->key,key), iVar5 != 0)) {
      uVar9 = uVar7 + 1;
      uVar7 = uVar2;
      if ((long)uVar9 < (long)uVar3) {
        do {
          if ((ppSVar4[uVar9] != (SUNHashMapKeyValue)0x0) &&
             (iVar5 = strcmp(ppSVar4[uVar9]->key,key), uVar7 = uVar9, iVar5 == 0)) break;
          uVar9 = uVar9 + 1;
          uVar7 = uVar2;
        } while (uVar3 != uVar9);
      }
      if (uVar7 == 0xffffffffffffff9d) {
        return -99;
      }
    }
    iVar10 = -1;
    if (ppSVar4 != (SUNHashMapKeyValue *)0x0 && (-1 < (long)uVar7 && (long)uVar7 < (long)uVar3)) {
      *value = ppSVar4[uVar7]->value;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int64_t SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int64_t idx;
  int64_t retval;
  sunbooleantype collision;

  if (map == NULL || key == NULL || value == NULL) { return SUNHASHMAP_ERROR; }

  idx = sunHashMapIdxFromKey(map, key);

  SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, idx);

  /* Check for a collision (NULL kvp means there was a collision at one point, but
     the colliding key has since been removed)*/
  collision = kvp ? strcmp(kvp->key, key) : SUNTRUE;

  /* Resolve a collision via linear probing */
  if (collision)
  {
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval == SUNHASHMAP_ERROR)
    {
      /* the key was either not found anywhere or an error occurred */
      return retval;
    }
    else { idx = retval; }
  }

  /* Return a reference to the value only */
  SUNHashMapKeyValue* kvp_ptr = SUNStlVector_SUNHashMapKeyValue_At(map->buckets,
                                                                   idx);
  if (kvp_ptr) { *value = (*kvp_ptr)->value; }
  else { return SUNHASHMAP_KEYNOTFOUND; }

  return (0);
}